

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_ea566c::DescriptorImpl::ToPrivateString
          (DescriptorImpl *this,SigningProvider *arg,string *out)

{
  int iVar1;
  long in_FS_OFFSET;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (*(this->super_Descriptor)._vptr_Descriptor[0x13])();
  AddChecksum(&local_40,out);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (out,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return SUB41(iVar1,0);
  }
  __stack_chk_fail();
}

Assistant:

bool ToPrivateString(const SigningProvider& arg, std::string& out) const override
    {
        bool ret = ToStringHelper(&arg, out, StringType::PRIVATE);
        out = AddChecksum(out);
        return ret;
    }